

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGInfo *info;
  LodePNGColorMode *color;
  LodePNGColorMode *dest;
  LodePNGColorType colortype;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uchar uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uchar *puVar16;
  byte *chunk;
  uchar *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  size_t bytewidth;
  size_t sVar25;
  size_t __size;
  uint uVar26;
  uint uVar27;
  uchar *puVar28;
  ulong local_2b0;
  uchar *scanlines;
  size_t scanlines_size;
  size_t *local_248;
  uchar **local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar10 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar10;
  if (uVar10 != 0) {
    return uVar10;
  }
  uVar10 = *w;
  uVar26 = *h;
  uVar13 = 0x5c;
  if (CONCAT44(0,uVar26) * (ulong)uVar10 >> 0x3d != 0) {
LAB_00121648:
    state->error = uVar13;
    return uVar13;
  }
  colortype = (state->info_raw).colortype;
  uVar13 = (state->info_raw).bitdepth;
  uVar12 = (state->info_png).color.bitdepth;
  uVar11 = getNumColorChannels((state->info_png).color.colortype);
  uVar11 = uVar11 * uVar12;
  uVar12 = getNumColorChannels(colortype);
  uVar12 = uVar12 * uVar13;
  if (uVar12 < uVar11) {
    uVar12 = uVar11;
  }
  uVar13 = 0x5c;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ((ulong)(uVar10 & 7) * (ulong)uVar12 + 7 >> 3) +
                 (ulong)(uVar10 >> 3) * (ulong)uVar12 + 5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = CONCAT44(0,uVar26);
  if (SUB168(auVar4 * auVar5,8) != 0) goto LAB_00121648;
  puVar16 = (uchar *)malloc(insize);
  if (puVar16 == (uchar *)0x0) {
    uVar13 = 0x53;
    goto LAB_00121648;
  }
  info = &state->info_png;
  color = &(state->info_png).color;
  dest = &state->info_raw;
  chunk = in + 0x21;
  local_240 = (state->info_png).unknown_chunks_data;
  local_248 = (state->info_png).unknown_chunks_size;
  iVar14 = 1;
  uVar19 = 0;
LAB_001211ff:
  if ((chunk < in) || (insize < chunk + (0xc - (long)in))) {
    bVar8 = true;
    if ((state->decoder).ignore_end != 0) goto LAB_0012169d;
    uVar10 = 0x1e;
LAB_00121695:
    state->error = uVar10;
LAB_0012169b:
    bVar8 = false;
    goto LAB_0012169d;
  }
  if ((int)((uint)*chunk << 0x18) < 0) {
    bVar8 = true;
    if ((state->decoder).ignore_end == 0) {
      uVar10 = 0x3f;
      goto LAB_00121695;
    }
    goto LAB_0012169d;
  }
  uVar26 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 | (uint)*chunk << 0x18;
  uVar21 = (ulong)uVar26;
  uVar10 = 0x40;
  if ((insize < chunk + (0xc - (long)in) + uVar21) || (chunk + uVar21 + 0xc < in))
  goto LAB_00121695;
  data = chunk + 8;
  uVar9 = lodepng_chunk_type_equals(chunk,"IDAT");
  if (uVar9 != '\0') {
    uVar10 = 0x5f;
    uVar20 = uVar19 + uVar21;
    if ((!CARRY8(uVar19,uVar21)) && (uVar20 <= insize)) {
      iVar14 = 3;
      if (uVar21 != 0) {
        memcpy(puVar16 + uVar19,data,uVar21);
      }
      goto LAB_001212bd;
    }
    goto LAB_00121695;
  }
  uVar9 = lodepng_chunk_type_equals(chunk,"IEND");
  if (uVar9 == '\0') {
    uVar9 = lodepng_chunk_type_equals(chunk,"PLTE");
    if (uVar9 != '\0') {
      uVar10 = readChunk_PLTE(color,data,uVar21);
      state->error = uVar10;
      bVar7 = false;
      if (uVar10 == 0) {
        bVar6 = true;
        iVar14 = 2;
        goto LAB_00121388;
      }
      goto LAB_0012169b;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"tRNS");
    if (uVar9 != '\0') {
      uVar10 = readChunk_tRNS(color,data,uVar21);
LAB_00121374:
      state->error = uVar10;
      bVar7 = false;
      if (uVar10 == 0) {
        bVar6 = true;
        goto LAB_00121388;
      }
      goto LAB_0012169b;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"bKGD");
    if (uVar9 != '\0') {
      uVar10 = readChunk_bKGD(info,data,uVar21);
      goto LAB_00121374;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"tEXt");
    uVar20 = uVar19;
    if (uVar9 != '\0') {
      if ((state->decoder).read_text_chunks == 0) {
LAB_001212bd:
        bVar6 = true;
        bVar7 = false;
        uVar19 = uVar20;
        goto LAB_00121388;
      }
      uVar10 = readChunk_tEXt(info,data,uVar21);
LAB_0012146b:
      bVar6 = true;
      state->error = uVar10;
      bVar7 = false;
      bVar8 = false;
      if (uVar10 == 0) goto LAB_00121388;
      goto LAB_0012169d;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"zTXt");
    if (uVar9 != '\0') {
      if ((state->decoder).read_text_chunks != 0) {
        uVar10 = readChunk_zTXt(info,(LodePNGDecompressSettings *)state,data,uVar21);
        goto LAB_0012146b;
      }
      goto LAB_001212bd;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"iTXt");
    if (uVar9 != '\0') {
      if ((state->decoder).read_text_chunks != 0) {
        uVar10 = readChunk_iTXt(info,(LodePNGDecompressSettings *)state,data,uVar21);
        goto LAB_0012146b;
      }
      goto LAB_001212bd;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"tIME");
    if (uVar9 != '\0') {
      uVar10 = readChunk_tIME(info,data,uVar21);
      goto LAB_00121374;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"pHYs");
    if (uVar9 != '\0') {
      uVar10 = readChunk_pHYs(info,data,uVar21);
LAB_001214d5:
      state->error = uVar10;
LAB_001214df:
      bVar7 = false;
      if (uVar10 == 0) {
        bVar6 = true;
        goto LAB_00121388;
      }
      bVar8 = false;
      goto LAB_0012169d;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"gAMA");
    if (uVar9 != '\0') {
      if (uVar26 == 4) {
        (state->info_png).gama_defined = 1;
        uVar10 = *(uint *)(chunk + 8);
        (state->info_png).gama_gamma =
             uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
LAB_0012152d:
        state->error = 0;
        goto LAB_001212bd;
      }
      uVar10 = 0x60;
      goto LAB_00121695;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"cHRM");
    if (uVar9 != '\0') {
      uVar10 = readChunk_cHRM(info,data,uVar21);
      goto LAB_001214d5;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"sRGB");
    if (uVar9 != '\0') {
      if (uVar26 == 1) {
        (state->info_png).srgb_defined = 1;
        (state->info_png).srgb_intent = (uint)*data;
        goto LAB_0012152d;
      }
      uVar10 = 0x62;
      goto LAB_00121695;
    }
    uVar9 = lodepng_chunk_type_equals(chunk,"iCCP");
    if (uVar9 != '\0') {
      uVar10 = readChunk_iCCP(info,(LodePNGDecompressSettings *)state,data,uVar21);
      state->error = uVar10;
      goto LAB_001214df;
    }
    if (((state->decoder).ignore_critical == 0) && ((chunk[4] & 0x20) == 0)) {
      uVar10 = 0x45;
      goto LAB_00121695;
    }
    if ((state->decoder).remember_unknown_chunks != 0) {
      uVar10 = lodepng_chunk_append(local_240 + (iVar14 - 1U),local_248 + (iVar14 - 1U),chunk);
      state->error = uVar10;
      bVar7 = false;
      bVar8 = false;
      if (uVar10 == 0) goto LAB_001213a3;
      goto LAB_0012169d;
    }
    bVar7 = false;
  }
  else {
    bVar7 = true;
    bVar6 = false;
LAB_00121388:
    if (((state->decoder).ignore_crc == 0) && (uVar10 = lodepng_chunk_check_crc(chunk), uVar10 != 0)
       ) {
      uVar10 = 0x39;
      goto LAB_00121695;
    }
    if (!bVar6) goto LAB_001213b3;
  }
LAB_001213a3:
  chunk = lodepng_chunk_next_const(chunk,in + insize);
LAB_001213b3:
  if (bVar7) goto LAB_00121687;
  goto LAB_001211ff;
LAB_00121687:
  bVar8 = true;
LAB_0012169d:
  if ((color->colortype == LCT_PALETTE) && ((state->info_png).color.palette == (uchar *)0x0)) {
    state->error = 0x6a;
  }
  else if (bVar8) {
    uVar10 = (state->info_png).interlace_method;
    uVar26 = (state->info_png).color.bitdepth;
    uVar13 = getNumColorChannels(color->colortype);
    uVar13 = uVar13 * uVar26;
    uVar26 = *w;
    uVar21 = (ulong)uVar13;
    if (uVar10 == 0) {
      sVar25 = (uVar21 * (uVar26 >> 3) + (ulong)((uVar26 & 7) * uVar13 + 7 >> 3) + 1) * (ulong)*h;
    }
    else {
      uVar12 = *h;
      lVar23 = (uVar26 + 7 >> 6) * uVar21 + (ulong)((uVar26 + 7 >> 3 & 7) * uVar13 + 7 >> 3) + 1;
      uVar10 = uVar26 + 3;
      if (4 < uVar26) {
        lVar23 = lVar23 + (ulong)((uVar10 >> 3 & 7) * uVar13 + 7 >> 3) + (uVar10 >> 6) * uVar21 + 1;
      }
      lVar23 = (ulong)(uVar12 + 3 >> 3) *
               ((uVar10 >> 5) * uVar21 + (ulong)((uVar10 >> 2 & 7) * uVar13 + 7 >> 3) + 1) +
               lVar23 * (ulong)(uVar12 + 7 >> 3);
      uVar10 = uVar26 + 1;
      if (2 < uVar26) {
        lVar23 = lVar23 + (ulong)(uVar12 + 3 >> 2) *
                          ((ulong)((uVar10 >> 2 & 7) * uVar13 + 7 >> 3) + (uVar10 >> 5) * uVar21 + 1
                          );
      }
      lVar23 = (ulong)(uVar12 + 1 >> 2) *
               ((uVar10 >> 4) * uVar21 + (ulong)((uVar10 >> 1 & 7) * uVar13 + 7 >> 3) + 1) + lVar23;
      if (1 < uVar26) {
        lVar23 = lVar23 + (ulong)(uVar12 + 1 >> 1) *
                          ((ulong)((uVar26 >> 1 & 7) * uVar13 + 7 >> 3) + (uVar26 >> 4) * uVar21 + 1
                          );
      }
      sVar25 = ((uVar26 >> 3) * uVar21 + (ulong)((uVar26 & 7) * uVar13 + 7 >> 3) + 1) *
               (ulong)(uVar12 >> 1) + lVar23;
    }
    uVar10 = zlib_decompress(&scanlines,&scanlines_size,sVar25,puVar16,uVar19,
                             (LodePNGDecompressSettings *)state);
    state->error = uVar10;
    if ((uVar10 != 0) || (scanlines_size == sVar25)) {
      free(puVar16);
      if (uVar10 != 0) goto LAB_001218e5;
      uVar10 = *w;
      uVar26 = *h;
      uVar13 = (state->info_png).color.bitdepth;
      uVar12 = getNumColorChannels((state->info_png).color.colortype);
      uVar12 = uVar12 * uVar13;
      uVar19 = (ulong)uVar12;
      uVar21 = (ulong)uVar26 * (ulong)uVar10;
      __size = (((uint)uVar21 & 7) * uVar19 + 7 >> 3) + (uVar21 >> 3) * uVar19;
      puVar16 = (uchar *)malloc(__size);
      *out = puVar16;
      if (puVar16 == (uchar *)0x0) {
        state->error = 0x53;
        goto LAB_001218e5;
      }
      if (__size != 0) {
        memset(puVar16,0,__size);
      }
      puVar17 = scanlines;
      if (uVar12 == 0) {
        uVar13 = 0x1f;
      }
      else {
        if ((state->info_png).interlace_method == 0) {
          if (uVar12 < 8) {
            uVar11 = uVar12 * uVar10;
            uVar27 = uVar11 + 7 & 0xfffffff8;
            if (uVar11 != uVar27) {
              uVar13 = unfilter(scanlines,scanlines,uVar10,uVar26,uVar12);
              if (uVar13 != 0) goto LAB_00121e3d;
              removePaddingBits(puVar16,puVar17,(ulong)uVar11,(ulong)uVar27,uVar26);
              goto LAB_00121e37;
            }
          }
          uVar13 = unfilter(puVar16,scanlines,uVar10,uVar26,uVar12);
          if (uVar13 != 0) goto LAB_00121e3d;
        }
        else {
          Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar10,uVar26,
                              uVar12);
          lVar23 = 0;
          do {
            lVar3 = *(long *)((long)padded_passstart + lVar23 * 2);
            uVar11 = *(uint *)((long)passw + lVar23);
            uVar27 = *(uint *)((long)passh + lVar23);
            uVar13 = unfilter(puVar17 + lVar3,
                              puVar17 + *(long *)((long)filter_passstart + lVar23 * 2),uVar11,uVar27
                              ,uVar12);
            if (uVar13 != 0) goto LAB_00121e3d;
            if (uVar12 < 8) {
              uVar11 = uVar11 * uVar12;
              removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar23 * 2),puVar17 + lVar3,
                                (ulong)uVar11,(ulong)(uVar11 + 7 & 0xfffffff8),uVar27);
            }
            lVar23 = lVar23 + 4;
          } while (lVar23 != 0x1c);
          Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,uVar10
                              ,uVar26,uVar12);
          if (uVar12 < 8) {
            lVar23 = 0;
            do {
              uVar26 = passh_1[lVar23];
              if ((ulong)uVar26 != 0) {
                uVar13 = passw_1[lVar23];
                local_2b0 = 0;
                do {
                  if ((ulong)uVar13 != 0) {
                    sVar25 = local_1b8[lVar23];
                    uVar11 = ADAM7_IY[lVar23];
                    uVar27 = ADAM7_DY[lVar23];
                    uVar1 = ADAM7_IX[lVar23];
                    uVar2 = ADAM7_DX[lVar23];
                    uVar21 = 0;
                    do {
                      uVar18 = (uVar21 * uVar2 + (ulong)uVar1) * uVar19 +
                               (uVar27 * local_2b0 + (ulong)uVar11) * (ulong)(uVar10 * uVar12);
                      uVar22 = (ulong)(((int)local_2b0 * uVar13 + (int)uVar21) * uVar12) +
                               sVar25 * 8;
                      uVar20 = uVar19;
                      do {
                        bVar24 = '\x01' << (~(byte)uVar18 & 7);
                        if ((puVar17[uVar22 >> 3] >> (~(byte)uVar22 & 7) & 1) == 0) {
                          puVar16[uVar18 >> 3] = puVar16[uVar18 >> 3] & ~bVar24;
                        }
                        else {
                          puVar16[uVar18 >> 3] = puVar16[uVar18 >> 3] | bVar24;
                        }
                        uVar18 = uVar18 + 1;
                        uVar22 = uVar22 + 1;
                        uVar15 = (int)uVar20 - 1;
                        uVar20 = (ulong)uVar15;
                      } while (uVar15 != 0);
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != uVar13);
                  }
                  local_2b0 = local_2b0 + 1;
                } while (local_2b0 != uVar26);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 7);
          }
          else {
            uVar19 = (ulong)(uVar12 >> 3);
            lVar23 = 0;
            do {
              uVar26 = passh_1[lVar23];
              if ((ulong)uVar26 != 0) {
                uVar13 = passw_1[lVar23];
                uVar21 = 0;
                uVar20 = 0;
                do {
                  iVar14 = (int)uVar21;
                  if ((ulong)uVar13 != 0) {
                    uVar12 = ADAM7_DX[lVar23];
                    puVar28 = puVar16 + ((ADAM7_DY[lVar23] * uVar20 + (ulong)ADAM7_IY[lVar23]) *
                                         (ulong)uVar10 + (ulong)ADAM7_IX[lVar23]) * uVar19;
                    sVar25 = local_1b8[lVar23];
                    uVar18 = 0;
                    do {
                      uVar22 = 0;
                      do {
                        puVar28[uVar22] = puVar17[uVar22 + uVar21 * uVar19 + sVar25];
                        uVar22 = uVar22 + 1;
                      } while (uVar19 != uVar22);
                      uVar18 = uVar18 + 1;
                      puVar28 = puVar28 + uVar12 * uVar19;
                      uVar21 = (ulong)((int)uVar21 + 1);
                    } while (uVar18 != uVar13);
                  }
                  uVar20 = uVar20 + 1;
                  uVar21 = (ulong)(iVar14 + uVar13);
                } while (uVar20 != uVar26);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != 7);
          }
        }
LAB_00121e37:
        uVar13 = 0;
      }
LAB_00121e3d:
      state->error = uVar13;
      goto LAB_001218e5;
    }
    state->error = 0x5b;
  }
  free(puVar16);
LAB_001218e5:
  free(scanlines);
  uVar10 = state->error;
  if (uVar10 == 0) {
    if ((state->decoder).color_convert == 0) {
      uVar10 = lodepng_color_mode_copy(dest,color);
      state->error = uVar10;
    }
    else {
      iVar14 = lodepng_color_mode_equal(dest,color);
      uVar10 = 0;
      if (iVar14 == 0) {
        puVar16 = *out;
        if (((dest->colortype | LCT_GREY_ALPHA) == LCT_RGBA) ||
           (uVar10 = 0x38, (state->info_raw).bitdepth == 8)) {
          uVar10 = *w;
          uVar26 = *h;
          uVar13 = (state->info_raw).bitdepth;
          uVar12 = getNumColorChannels(dest->colortype);
          uVar19 = (ulong)(uVar13 * uVar12);
          uVar21 = (ulong)uVar26 * (ulong)uVar10;
          puVar17 = (uchar *)malloc((((uint)uVar21 & 7) * uVar19 + 7 >> 3) + (uVar21 >> 3) * uVar19)
          ;
          *out = puVar17;
          if (puVar17 == (uchar *)0x0) {
            uVar10 = 0x53;
          }
          else {
            uVar10 = lodepng_convert(puVar17,puVar16,dest,color,uVar10,uVar26);
          }
          state->error = uVar10;
          free(puVar16);
          uVar10 = state->error;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}